

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t mime_mem_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  long lVar1;
  size_t sVar2;
  undefined8 local_40;
  size_t sz;
  curl_mimepart *part;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  local_40 = (char *)curlx_sotouz(*(long *)((long)instream + 0x70) -
                                  *(long *)((long)instream + 0x88));
  if (nitems == 0) {
    buffer_local = (char *)0xfffffffffffffffe;
  }
  else {
    if (nitems < local_40) {
      local_40 = (char *)nitems;
    }
    if (local_40 != (char *)0x0) {
      lVar1 = *(long *)((long)instream + 0x18);
      sVar2 = curlx_sotouz(*(curl_off_t *)((long)instream + 0x88));
      memcpy(buffer,(void *)(lVar1 + sVar2),(size_t)local_40);
    }
    buffer_local = local_40;
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t mime_mem_read(char *buffer, size_t size, size_t nitems,
                            void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t sz = curlx_sotouz(part->datasize - part->state.offset);
  (void) size;   /* Always 1.*/

  if(!nitems)
    return STOP_FILLING;

  if(sz > nitems)
    sz = nitems;

  if(sz)
    memcpy(buffer, part->data + curlx_sotouz(part->state.offset), sz);

  return sz;
}